

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall fasttext::Loss::Loss(Loss *this,shared_ptr<fasttext::Matrix> *wo)

{
  undefined8 in_RAX;
  int i;
  int iVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 local_28;
  
  this->_vptr_Loss = (_func_int **)&PTR__Loss_00143aa8;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_sigmoid_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->t_log_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->wo_ = wo;
  local_28 = in_RAX;
  std::vector<float,_std::allocator<float>_>::reserve(&this->t_sigmoid_,0x201);
  for (iVar1 = 0; iVar1 != 0x2010; iVar1 = iVar1 + 0x10) {
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar2 = vxorps_avx512vl(ZEXT416((uint)((float)iVar1 * 0.001953125 + -8.0)),auVar2);
    fVar3 = expf(auVar2._0_4_);
    local_28 = CONCAT44(1.0 / (fVar3 + 1.0),(float)local_28);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&this->t_sigmoid_,(float *)((long)&local_28 + 4));
  }
  std::vector<float,_std::allocator<float>_>::reserve(&this->t_log_,0x201);
  for (iVar1 = 0; iVar1 != 0x201; iVar1 = iVar1 + 1) {
    fVar3 = logf(((float)iVar1 + 1e-05) * 0.001953125);
    local_28 = CONCAT44(local_28._4_4_,fVar3);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&this->t_log_,(float *)&local_28);
  }
  return;
}

Assistant:

Loss::Loss(std::shared_ptr<Matrix>& wo) : wo_(wo) {
  t_sigmoid_.reserve(SIGMOID_TABLE_SIZE + 1);
  for (int i = 0; i < SIGMOID_TABLE_SIZE + 1; i++) {
    real x = real(i * 2 * MAX_SIGMOID) / SIGMOID_TABLE_SIZE - MAX_SIGMOID;
    t_sigmoid_.push_back(1.0 / (1.0 + std::exp(-x)));
  }

  t_log_.reserve(LOG_TABLE_SIZE + 1);
  for (int i = 0; i < LOG_TABLE_SIZE + 1; i++) {
    real x = (real(i) + 1e-5) / LOG_TABLE_SIZE;
    t_log_.push_back(std::log(x));
  }
}